

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

RESULT_TYPE __thiscall
duckdb::QuantileComposed<duckdb::MadAccessor<int,_int,_int>,_duckdb::QuantileIndirect<int>_>::
operator()(QuantileComposed<duckdb::MadAccessor<int,_int,_int>,_duckdb::QuantileIndirect<int>_>
           *this,idx_t *input)

{
  DataChunk *result;
  MadAccessor<int,_int,_int> *pMVar1;
  CURSOR *pCVar2;
  ulong seek_idx;
  int iVar3;
  reference pvVar4;
  ulong uVar5;
  
  pMVar1 = this->outer;
  pCVar2 = this->inner->data;
  seek_idx = *input;
  uVar5 = (pCVar2->scan).current_row_index;
  if ((pCVar2->scan).next_row_index <= seek_idx || seek_idx < uVar5) {
    result = &pCVar2->page;
    ColumnDataCollection::Seek(pCVar2->inputs,seek_idx,&pCVar2->scan,result);
    pvVar4 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    pCVar2->data = (int *)pvVar4->data;
    pvVar4 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    FlatVector::VerifyFlatVector(pvVar4);
    pCVar2->validity = &pvVar4->validity;
    uVar5 = (pCVar2->scan).current_row_index;
  }
  iVar3 = pCVar2->data[(uint)((int)seek_idx - (int)uVar5)] - *pMVar1->median;
  if (iVar3 < 1) {
    iVar3 = -iVar3;
  }
  return iVar3;
}

Assistant:

inline RESULT_TYPE operator()(const idx_t &input) const {
		return outer(inner(input));
	}